

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleString_CreateSequenceOfZero_Test::testBody
          (TEST_SimpleString_CreateSequenceOfZero_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString local_60;
  SimpleString local_50 [2];
  undefined1 local_30 [8];
  SimpleString actual;
  SimpleString expected;
  TEST_SimpleString_CreateSequenceOfZero_Test *this_local;
  
  SimpleString::SimpleString((SimpleString *)&actual.bufferSize_,"");
  SimpleString::SimpleString((SimpleString *)local_30,"hello",0);
  bVar1 = operator!=((SimpleString *)&actual.bufferSize_,(SimpleString *)local_30);
  if (bVar1) {
    bVar1 = operator!=((SimpleString *)local_30,(SimpleString *)local_30);
    if (bVar1) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0xd5);
    }
    bVar1 = operator!=((SimpleString *)&actual.bufferSize_,(SimpleString *)&actual.bufferSize_);
    if (bVar1) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0xd5);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(local_50);
    pcVar2 = SimpleString::asCharString(local_50);
    StringFrom(&local_60);
    pcVar3 = SimpleString::asCharString(&local_60);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0xd5,pTVar5);
    SimpleString::~SimpleString(&local_60);
    SimpleString::~SimpleString(local_50);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0xd5,pTVar5);
  }
  SimpleString::~SimpleString((SimpleString *)local_30);
  SimpleString::~SimpleString((SimpleString *)&actual.bufferSize_);
  return;
}

Assistant:

TEST(SimpleString, CreateSequenceOfZero)
{
    SimpleString expected("");
    SimpleString actual("hello", 0);

    CHECK_EQUAL(expected, actual);
}